

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinePaintScheme.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::MinePaintScheme::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,MinePaintScheme *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"MinePaintScheme:",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tAlgae:           ",0x13);
  ENUMS::GetEnumAsStringMineAlgae_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((this->m_PntScmUnion).m_ui8PntSchm & 3),Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tPaint Scheme:    ",0x13);
  ENUMS::GetEnumAsStringPaintScheme_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)((this->m_PntScmUnion).m_ui8PntSchm >> 2),Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString MinePaintScheme::GetAsString() const
{
    KStringStream ss;

    ss << "MinePaintScheme:"
       << "\n\tAlgae:           " << GetEnumAsStringMineAlgae( m_PntScmUnion.m_ui8Alg )
       << "\n\tPaint Scheme:    " << GetEnumAsStringPaintScheme( m_PntScmUnion.m_ui8Scm )
       << "\n";

    return ss.str();
}